

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<true> *handler)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  Ch *pCVar4;
  Ch *pCVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  BaseState<true> *pBVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  byte *pbVar17;
  byte bVar18;
  uint uVar19;
  bool bVar20;
  double dVar21;
  undefined4 uVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined4 extraout_var;
  
  pbVar3 = (byte *)is->src_;
  pCVar4 = is->head_;
  bVar2 = *pbVar3;
  pbVar10 = pbVar3;
  bVar18 = bVar2;
  if (bVar2 == 0x2d) {
    pbVar10 = pbVar3 + 1;
    bVar18 = pbVar3[1];
  }
  pCVar5 = is->dst_;
  if (bVar18 == 0x30) {
    uVar19 = (uint)pbVar10[1];
    pbVar10 = pbVar10 + 1;
    dVar21 = 0.0;
    bVar20 = false;
    bVar6 = false;
    iVar13 = 0;
    uVar12 = 0;
    bVar7 = false;
    uVar11 = 0;
  }
  else {
    if (8 < (byte)(bVar18 - 0x31)) {
      *(undefined4 *)(this + 0x30) = 3;
      *(long *)(this + 0x38) = (long)pbVar10 - (long)pCVar4;
      goto LAB_00114f35;
    }
    uVar11 = (ulong)(bVar18 - 0x30);
    bVar18 = pbVar10[1];
    uVar15 = (ulong)bVar18;
    pbVar10 = pbVar10 + 1;
    dVar21 = 0.0;
    if (bVar2 == 0x2d) {
      if ((byte)(bVar18 - 0x30) < 10) {
        iVar13 = 0;
LAB_0011499e:
        uVar19 = (uint)uVar11;
        if (uVar19 < 0xccccccc) {
LAB_001149a6:
          uVar11 = (ulong)((uVar19 * 10 + (int)uVar15) - 0x30);
          iVar13 = iVar13 + 1;
          bVar18 = pbVar10[1];
          uVar15 = (ulong)bVar18;
          pbVar10 = pbVar10 + 1;
          if (9 < (byte)(bVar18 - 0x30)) goto LAB_00114a7a;
          goto LAB_0011499e;
        }
        if (uVar19 != 0xccccccc) goto LAB_00114a1e;
        if ((byte)uVar15 < 0x39) goto LAB_001149a6;
        uVar11 = 0xccccccc;
        uVar15 = 0x39;
LAB_00114a1e:
        uVar12 = uVar11;
        if (bVar2 == 0x2d) {
          do {
            if ((0xccccccccccccccb < uVar12) && (0x38 < (byte)uVar15 || uVar12 != 0xccccccccccccccc)
               ) goto LAB_00114ad2;
            uVar12 = (uVar15 & 0xf) + uVar12 * 10;
            iVar13 = iVar13 + 1;
            bVar18 = pbVar10[1];
            uVar15 = (ulong)bVar18;
            pbVar10 = pbVar10 + 1;
          } while ((byte)(bVar18 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < uVar12) &&
               (0x35 < (byte)uVar15 || uVar12 != 0x1999999999999999)) goto LAB_00114ad2;
            uVar12 = (uVar15 & 0xf) + uVar12 * 10;
            iVar13 = iVar13 + 1;
            bVar18 = pbVar10[1];
            uVar15 = (ulong)bVar18;
            pbVar10 = pbVar10 + 1;
          } while ((byte)(bVar18 - 0x30) < 10);
        }
        uVar19 = (uint)bVar18;
        dVar21 = 0.0;
        bVar7 = true;
        bVar20 = false;
        bVar6 = false;
        goto LAB_00114b4b;
      }
LAB_00114d8e:
      iVar13 = 0;
    }
    else {
      if (9 < (byte)(bVar18 - 0x30)) goto LAB_00114d8e;
      iVar13 = 0;
      do {
        uVar19 = (uint)uVar11;
        if (0x19999998 < uVar19) {
          if (uVar19 != 0x19999999) goto LAB_00114a1e;
          if (0x35 < (byte)uVar15) {
            uVar11 = 0x19999999;
            goto LAB_00114a1e;
          }
        }
        uVar11 = (ulong)((uVar19 * 10 + (int)uVar15) - 0x30);
        iVar13 = iVar13 + 1;
        bVar18 = pbVar10[1];
        uVar15 = (ulong)bVar18;
        pbVar10 = pbVar10 + 1;
      } while ((byte)(bVar18 - 0x30) < 10);
    }
LAB_00114a7a:
    uVar19 = (uint)bVar18;
    bVar6 = false;
    bVar20 = false;
    uVar12 = 0;
    bVar7 = false;
  }
  goto LAB_00114b4b;
LAB_00114cf8:
  do {
    pbVar17 = pbVar10 + 1;
    pbVar10 = pbVar10 + 1;
  } while ((byte)(*pbVar17 - 0x30) < 10);
  goto LAB_00114dfe;
LAB_00114ad2:
  auVar24._8_4_ = (int)(uVar12 >> 0x20);
  auVar24._0_8_ = uVar12;
  auVar24._12_4_ = 0x45300000;
  dVar21 = (auVar24._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
  do {
    if (1.7976931348623158e+307 <= dVar21) goto LAB_00114de6;
    dVar21 = dVar21 * 10.0 + (double)((int)uVar15 + -0x30);
    bVar18 = pbVar10[1];
    uVar15 = (ulong)bVar18;
    uVar19 = (uint)bVar18;
    pbVar10 = pbVar10 + 1;
  } while ((byte)(bVar18 - 0x30) < 10);
  bVar20 = true;
  bVar6 = true;
  bVar7 = true;
LAB_00114b4b:
  if ((char)uVar19 == '.') {
    pbVar17 = pbVar10 + 1;
    uVar19 = (uint)*pbVar17;
    pbVar10 = pbVar10 + 1;
    if (0xf5 < (byte)(*pbVar17 - 0x3a)) {
      iVar16 = 0;
      if (bVar20) {
LAB_00114bfd:
        do {
          if (0x39 < (byte)uVar19) goto LAB_00114c3e;
          if (iVar13 < 0x11) {
            dVar21 = dVar21 * 10.0 + (double)(int)(uVar19 - 0x30);
            iVar16 = iVar16 + -1;
            if (0.0 < dVar21) {
              iVar13 = iVar13 + 1;
            }
          }
          pbVar17 = pbVar10 + 1;
          uVar19 = (uint)*pbVar17;
          pbVar10 = pbVar10 + 1;
        } while ('/' < (char)*pbVar17);
        pbVar17 = pbVar10;
        iVar13 = 0;
        goto LAB_00114e0e;
      }
      if (!bVar7) {
        uVar12 = uVar11;
      }
      iVar16 = 0;
      do {
        if ((0x39 < (byte)uVar19) || (uVar12 >> 0x35 != 0)) {
          auVar25._8_4_ = (int)(uVar12 >> 0x20);
          auVar25._0_8_ = uVar12;
          auVar25._12_4_ = 0x45300000;
          dVar21 = (auVar25._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
          bVar6 = true;
          goto LAB_00114bfd;
        }
        pbVar17 = pbVar10 + 1;
        iVar16 = iVar16 + -1;
        uVar12 = (ulong)(uVar19 - 0x30) + uVar12 * 10;
        iVar13 = iVar13 + (uint)(uVar12 != 0);
        pbVar1 = pbVar10 + 1;
        uVar19 = (uint)*pbVar1;
        pbVar10 = pbVar17;
      } while ('/' < (char)*pbVar1);
      dVar21 = (double)(long)uVar12;
      iVar13 = 0;
LAB_00114e13:
      uVar19 = iVar13 + iVar16;
      if ((int)uVar19 < -0x134) {
        dVar23 = 0.0;
        if (0xfffffd97 < uVar19) {
          dVar21 = (dVar21 / 1e+308) /
                   *(double *)(internal::Pow10(int)::e + (ulong)(-uVar19 - 0x134) * 8);
          dVar23 = dVar21;
        }
      }
      else if ((int)uVar19 < 0) {
        dVar21 = dVar21 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar19 * 8);
        dVar23 = dVar21;
      }
      else {
        dVar21 = dVar21 * *(double *)(internal::Pow10(int)::e + (ulong)uVar19 * 8);
        dVar23 = dVar21;
      }
      if (bVar2 == 0x2d) {
        dVar23 = -dVar23;
      }
      pBVar9 = (handler->ctx).current_state;
      iVar13 = (*pBVar9->_vptr_BaseState[2])
                         (CONCAT44((int)((ulong)dVar21 >> 0x20),(float)dVar23),pBVar9,handler);
      pBVar9 = (BaseState<true> *)CONCAT44(extraout_var_02,iVar13);
      pbVar10 = pbVar17;
LAB_00114efa:
      if (pBVar9 == (BaseState<true> *)0x0) {
        *(undefined4 *)(this + 0x30) = 0x10;
        *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar4;
      }
      else {
        (handler->ctx).previous_state = (handler->ctx).current_state;
        (handler->ctx).current_state = pBVar9;
      }
      goto LAB_00114f35;
    }
    lVar8 = (long)pbVar10 - (long)pCVar4;
    *(undefined4 *)(this + 0x30) = 0xe;
  }
  else {
    iVar16 = 0;
LAB_00114c3e:
    pbVar17 = pbVar10;
    iVar13 = 0;
    if ((uVar19 | 0x20) != 0x65) {
LAB_00114e0e:
      if (bVar6) goto LAB_00114e13;
      uVar22 = (undefined4)((ulong)dVar21 >> 0x20);
      pbVar10 = pbVar17;
      if (bVar7) {
        if (bVar2 == 0x2d) {
          pBVar9 = (handler->ctx).current_state;
          iVar13 = (*pBVar9->_vptr_BaseState[2])
                             (CONCAT44(uVar22,(float)(long)-uVar12),pBVar9,handler);
          pBVar9 = (BaseState<true> *)CONCAT44(extraout_var,iVar13);
        }
        else {
          pBVar9 = (handler->ctx).current_state;
          iVar13 = (*pBVar9->_vptr_BaseState[2])(CONCAT44(uVar22,(float)uVar12),pBVar9,handler);
          pBVar9 = (BaseState<true> *)CONCAT44(extraout_var_03,iVar13);
        }
      }
      else if (bVar2 == 0x2d) {
        pBVar9 = (handler->ctx).current_state;
        iVar13 = (*pBVar9->_vptr_BaseState[2])(CONCAT44(uVar22,(float)-(int)uVar11),pBVar9,handler);
        pBVar9 = (BaseState<true> *)CONCAT44(extraout_var_00,iVar13);
      }
      else {
        pBVar9 = (handler->ctx).current_state;
        iVar13 = (*pBVar9->_vptr_BaseState[3])(pBVar9,handler);
        pBVar9 = (BaseState<true> *)CONCAT44(extraout_var_01,iVar13);
      }
      goto LAB_00114efa;
    }
    uVar15 = uVar11;
    if (bVar7) {
      uVar15 = uVar12;
    }
    if (!bVar6) {
      auVar26._8_4_ = (int)(uVar15 >> 0x20);
      auVar26._0_8_ = uVar15;
      auVar26._12_4_ = 0x45300000;
      dVar21 = (auVar26._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0);
      bVar6 = true;
    }
    bVar18 = pbVar10[1];
    bVar20 = bVar18 != 0x2b;
    if ((bVar20) && (bVar18 != 0x2d)) {
      if ((byte)(bVar18 - 0x30) < 10) {
        pbVar10 = pbVar10 + 2;
        iVar14 = bVar18 - 0x30;
LAB_00114dbe:
        do {
          bVar18 = *pbVar10;
          if (9 < (byte)(bVar18 - 0x30)) {
            bVar20 = false;
            goto LAB_00114dfe;
          }
          pbVar10 = pbVar10 + 1;
          iVar14 = iVar14 * 10 + (uint)bVar18 + -0x30;
        } while (iVar14 <= 0x134 - iVar16);
LAB_00114de6:
        *(undefined4 *)(this + 0x30) = 0xd;
        *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar4;
        goto LAB_00114f35;
      }
      pbVar10 = pbVar10 + 1;
    }
    else {
      pbVar17 = pbVar10 + 2;
      if ((byte)(*pbVar17 - 0x30) < 10) {
        pbVar10 = pbVar10 + 3;
        iVar14 = *pbVar17 - 0x30;
        if (bVar18 == 0x2b) goto LAB_00114dbe;
        bVar18 = *pbVar10;
        if ((byte)(bVar18 - 0x30) < 10) {
          do {
            iVar14 = iVar14 * 10 + (uint)bVar18 + -0x30;
            if (0xccccccb < iVar14) goto LAB_00114cf8;
            pbVar10 = pbVar10 + 1;
            bVar18 = *pbVar10;
          } while ((byte)(bVar18 - 0x30) < 10);
        }
        else {
          bVar20 = true;
        }
LAB_00114dfe:
        pbVar17 = pbVar10;
        iVar13 = -iVar14;
        if (!bVar20) {
          iVar13 = iVar14;
        }
        goto LAB_00114e0e;
      }
      pbVar10 = pbVar10 + 2;
    }
    lVar8 = (long)pbVar10 - (long)pCVar4;
    *(undefined4 *)(this + 0x30) = 0xf;
  }
  *(long *)(this + 0x38) = lVar8;
LAB_00114f35:
  is->src_ = (Ch *)pbVar10;
  is->dst_ = pCVar5;
  is->head_ = pCVar4;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler)
  { internal::StreamLocalCopy<InputStream> copy(is);
    NumberStream<InputStream,
                 ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                 ((parseFlags & kParseInsituFlag) == 0) :
                 ((parseFlags & kParseFullPrecisionFlag) != 0),
                 (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                 (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

    size_t startOffset = s.Tell();
    double d = 0.0;
    bool useNanOrInf = false;

    // Parse minus
    bool minus = Consume(s, '-');

    // Parse int: zero / ( digit1-9 *DIGIT )
    unsigned i = 0;
    uint64_t i64 = 0;
    bool use64bit = false;
    int significandDigit = 0;
    if (RAPIDJSON_UNLIKELY(s.Peek() == '0'))
    { i = 0;
      s.TakePush();
    }
    else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9'))
    { i = static_cast<unsigned>(s.TakePush() - '0');

      if (minus)
        while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
        { if (RAPIDJSON_UNLIKELY(i >= 214748364))   // 2^31 = 2147483648
          { if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8'))
            { i64 = i;
              use64bit = true;
              break;
            }
          }
          i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
          significandDigit++;
        }
      else
        while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
        { if (RAPIDJSON_UNLIKELY(i >= 429496729))   // 2^32 - 1 = 4294967295
          { if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5'))
            { i64 = i;
              use64bit = true;
              break;
            }
          }
          i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
          significandDigit++;
        }
    }
    // Parse NaN or Infinity here
    else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N')))
    { useNanOrInf = true;
      if (RAPIDJSON_LIKELY(Consume(s, 'N') && Consume(s, 'a') && Consume(s, 'N')))
      { d = std::numeric_limits<double>::quiet_NaN();
      }
      else if (RAPIDJSON_LIKELY(Consume(s, 'I') && Consume(s, 'n') && Consume(s, 'f')))
      { d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
        if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                               && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y'))))
          RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
      }
      else
        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
    }
    else
      RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

    // Parse 64bit int
    bool useDouble = false;
    if (use64bit)
    { if (minus)
        while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
        { if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
            if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8'))
            { d = static_cast<double>(i64);
              useDouble = true;
              break;
            }
          i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
          significandDigit++;
        }
      else
        while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
        { if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
            if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5'))
            { d = static_cast<double>(i64);
              useDouble = true;
              break;
            }
          i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
          significandDigit++;
        }
    }

    // Force double for big integer
    if (useDouble)
    { while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
      { if (RAPIDJSON_UNLIKELY(d >= 1.7976931348623157e307)) // DBL_MAX / 10.0
          RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
        d = d * 10 + (s.TakePush() - '0');
      }
    }

    // Parse frac = decimal-point 1*DIGIT
    int expFrac = 0;
    size_t decimalPosition;
    if (Consume(s, '.'))
    { decimalPosition = s.Length();

      if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
        RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

      if (!useDouble)
      {
#if RAPIDJSON_64BIT
        // Use i64 to store significand in 64-bit architecture
        if (!use64bit)
          i64 = i;

        while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
        { if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
            break;
          else
          { i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
            --expFrac;
            if (i64 != 0)
              significandDigit++;
          }
        }

        d = static_cast<double>(i64);
#else
        // Use double to store significand in 32-bit architecture
        d = static_cast<double>(use64bit ? i64 : i);
#endif
        useDouble = true;
      }

      while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
      { if (significandDigit < 17)
        { d = d * 10.0 + (s.TakePush() - '0');
          --expFrac;
          if (RAPIDJSON_LIKELY(d > 0.0))
            significandDigit++;
        }
        else
          s.TakePush();
      }
    }
    else
      decimalPosition = s.Length(); // decimal position at the end of integer.

    // Parse exp = e [ minus / plus ] 1*DIGIT
    int exp = 0;
    if (Consume(s, 'e') || Consume(s, 'E'))
    { if (!useDouble)
      { d = static_cast<double>(use64bit ? i64 : i);
        useDouble = true;
      }

      bool expMinus = false;
      if (Consume(s, '+'))
        ;
      else if (Consume(s, '-'))
        expMinus = true;

      if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
      { exp = static_cast<int>(s.Take() - '0');
        if (expMinus)
        { while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
          { exp = exp * 10 + static_cast<int>(s.Take() - '0');
            if (exp >= 214748364)                           // Issue #313: prevent overflow exponent
            { while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                s.Take();
            }
          }
        }
        else    // positive exp
        { int maxExp = 308 - expFrac;
          while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9'))
          { exp = exp * 10 + static_cast<int>(s.Take() - '0');
            if (RAPIDJSON_UNLIKELY(exp > maxExp))
              RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
          }
        }
      }
      else
        RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

      if (expMinus)
        exp = -exp;
    }

    // Finish parsing, call event according to the type of number.
    bool cont = true;

    if (parseFlags & kParseNumbersAsStringsFlag)
    { if (parseFlags & kParseInsituFlag)
      { s.Pop();  // Pop stack no matter if it will be used or not.
        typename InputStream::Ch* head = is.PutBegin();
        const size_t length = s.Tell() - startOffset;
        RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
        // unable to insert the \0 character here, it will erase the comma after this number
        const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
        cont = handler.RawNumber(str, SizeType(length), false);
      }
      else
      { SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
        StringStream srcStream(s.Pop());
        StackStream<typename TargetEncoding::Ch> dstStream(stack_);
        while (numCharsToCopy--)
        { Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
        }
        dstStream.Put('\0');
        const typename TargetEncoding::Ch* str = dstStream.Pop();
        const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
        cont = handler.RawNumber(str, SizeType(length), true);
      }
    }
    else
    { size_t length = s.Length();
      const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

      if (useDouble)
      { int p = exp + expFrac;
        if (parseFlags & kParseFullPrecisionFlag)
          d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
        else
          d = internal::StrtodNormalPrecision(d, p);

        cont = handler.Double(minus ? -d : d);
      }
      else if (useNanOrInf)
      { cont = handler.Double(d);
      }
      else
      { if (use64bit)
        { if (minus)
            cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
          else
            cont = handler.Uint64(i64);
        }
        else
        { if (minus)
            cont = handler.Int(static_cast<int32_t>(~i + 1));
          else
            cont = handler.Uint(i);
        }
      }
    }
    if (RAPIDJSON_UNLIKELY(!cont))
      RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
  }